

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  char *src;
  char *out;
  ssize_t sVar4;
  long lVar5;
  long lVar6;
  int flags;
  int iVar7;
  ulong uVar8;
  char *__s;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  buffers b;
  base64_timespec end;
  base64_timespec start;
  size_t local_98;
  size_t local_90;
  long local_88;
  char *local_80;
  timespec local_78;
  timespec local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char *local_40;
  long local_38;
  
  local_98 = 0xa00000;
  local_90 = 0x10aaaaa;
  src = (char *)malloc(0xa00000);
  if (src == (char *)0x0) {
    iVar3 = 1;
    __s = "Out of memory";
  }
  else {
    out = (char *)malloc(0x10aaaaa);
    if (out == (char *)0x0) {
      iVar3 = 1;
      __s = "Out of memory";
    }
    else {
      bVar1 = false;
      iVar3 = open("/dev/urandom",0);
      if (iVar3 < 0) {
        __s = "Cannot open /dev/urandom";
      }
      else {
        bVar1 = true;
        printf("Filling buffer with %.1f MB of random data...\n",
               (double)((float)local_98 * 9.536743e-07));
        if (local_98 != 0) {
          __s = "Read error";
          uVar8 = 0;
          do {
            sVar4 = read(iVar3,src + uVar8,local_98 - uVar8);
            bVar1 = sVar4 >= 0;
            if (sVar4 < 0) goto LAB_001022e7;
            uVar8 = uVar8 + sVar4;
          } while (uVar8 < local_98);
        }
        __s = (char *)0x0;
LAB_001022e7:
        close(iVar3);
      }
      iVar3 = 1;
      if (bVar1) {
        lVar5 = 0;
        local_40 = __s;
        do {
          local_38 = lVar5;
          printf("Testing with buffer size %s, fastest of %d * %d\n",sizes[lVar5].label,
                 (ulong)(uint)sizes[lVar5].repeat,(ulong)(uint)sizes[lVar5].batch);
          if (*codecs != (char *)0x0) {
            lVar6 = 0;
            do {
              flags = 1 << ((byte)lVar6 & 0x1f);
              iVar3 = codec_supported(flags);
              if (iVar3 != 0) {
                local_80 = codecs[lVar6];
                local_98 = sizes[lVar5].len;
                iVar3 = sizes[lVar5].repeat;
                fVar9 = -1.0;
                local_88 = lVar6;
                if (iVar3 != 0) {
                  fVar9 = -1.0;
                  uVar10 = 0;
                  uVar11 = 0;
                  uVar12 = 0;
                  do {
                    local_58 = fVar9;
                    uStack_54 = uVar10;
                    uStack_50 = uVar11;
                    uStack_4c = uVar12;
                    clock_gettime(0,&local_68);
                    for (iVar7 = sizes[lVar5].batch; iVar7 != 0; iVar7 = iVar7 + -1) {
                      base64_encode(src,local_98,out,&local_90,flags);
                    }
                    clock_gettime(0,&local_78);
                    fVar9 = ((float)(local_78.tv_nsec - local_68.tv_nsec) / 1e+09 +
                            (float)(local_78.tv_sec - local_68.tv_sec)) / (float)sizes[lVar5].batch;
                    uVar11 = 0;
                    uVar12 = 0;
                    uVar10 = 0;
                    if (local_58 <= fVar9 && 0.0 <= local_58) {
                      uVar11 = uStack_50;
                      uVar12 = uStack_4c;
                      fVar9 = local_58;
                      uVar10 = uStack_54;
                    }
                    iVar3 = iVar3 + -1;
                  } while (iVar3 != 0);
                }
                printf("%s\tencode\t%.02f MB/sec\n",
                       (double)(((float)local_98 * 9.536743e-07) / fVar9),local_80);
                local_90 = sizes[lVar5].len;
                iVar3 = sizes[lVar5].repeat;
                fVar9 = -1.0;
                if (iVar3 != 0) {
                  fVar9 = -1.0;
                  uVar10 = 0;
                  uVar11 = 0;
                  uVar12 = 0;
                  do {
                    local_58 = fVar9;
                    uStack_54 = uVar10;
                    uStack_50 = uVar11;
                    uStack_4c = uVar12;
                    clock_gettime(0,&local_68);
                    for (iVar7 = sizes[lVar5].batch; iVar7 != 0; iVar7 = iVar7 + -1) {
                      base64_decode(out,local_90,src,&local_98,flags);
                    }
                    clock_gettime(0,&local_78);
                    fVar9 = ((float)(local_78.tv_nsec - local_68.tv_nsec) / 1e+09 +
                            (float)(local_78.tv_sec - local_68.tv_sec)) / (float)sizes[lVar5].batch;
                    uVar11 = 0;
                    uVar12 = 0;
                    uVar10 = 0;
                    if (local_58 <= fVar9 && 0.0 <= local_58) {
                      uVar11 = uStack_50;
                      uVar12 = uStack_4c;
                      fVar9 = local_58;
                      uVar10 = uStack_54;
                    }
                    iVar3 = iVar3 + -1;
                  } while (iVar3 != 0);
                }
                lVar6 = local_88;
                printf("%s\tdecode\t%.02f MB/sec\n",
                       (double)(((float)local_90 * 9.536743e-07) / fVar9),local_80);
              }
              lVar2 = lVar6 + 1;
              lVar6 = lVar6 + 1;
            } while (codecs[lVar2] != (char *)0x0);
          }
          lVar5 = local_38 + 1;
        } while (lVar5 != 5);
        iVar3 = 0;
        __s = local_40;
      }
      free(out);
    }
    free(src);
  }
  if (__s != (char *)0x0) {
    fputs(__s,_stderr);
  }
  return iVar3;
}

Assistant:

int
main ()
{
	int ret = 0;
	char *errmsg = NULL;
	struct buffers b;

	// Set buffer sizes to largest buffer length:
	b.regsz = sizes[0].len;
	b.encsz = sizes[0].len * 5 / 3;

	// Allocate space for megabytes of random data:
	if ((b.reg = malloc(b.regsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err0;
	}

	// Allocate space for encoded output:
	if ((b.enc = malloc(b.encsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err1;
	}

	// Fill buffer with random data:
	if (get_random_data(&b, &errmsg) == false) {
		ret = 1;
		goto err2;
	}

	// Loop over all buffer sizes:
	for (size_t i = 0; i < sizeof(sizes) / sizeof(sizes[0]); i++) {
		printf("Testing with buffer size %s, fastest of %d * %d\n",
			sizes[i].label, sizes[i].repeat, sizes[i].batch);

		// Loop over all codecs:
		for (size_t j = 0; codecs[j]; j++)
			if (codec_supported(1 << j))
				codec_bench(&b, &sizes[i], codecs[j], 1 << j);
	};

	// Free memory:
err2:	free(b.enc);
err1:	free(b.reg);
err0:	if (errmsg)
		fputs(errmsg, stderr);

	return ret;
}